

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_ffi.c
# Opt level: O0

TValue * ffi_clib_index(lua_State *L)

{
  TValue *pTVar1;
  CLibrary *cl;
  TValue *o;
  lua_State *L_local;
  
  pTVar1 = L->base;
  if (((pTVar1 < L->top) && ((int)(pTVar1->field_4).it >> 0xf == -0xd)) &&
     (*(char *)((pTVar1->u64 & 0x7fffffffffff) + 10) == '\x02')) {
    if ((pTVar1 + 1 < L->top) && ((int)pTVar1[1].field_4.it >> 0xf == -5)) {
      pTVar1 = lj_clib_index(L,(CLibrary *)((pTVar1->u64 & 0x7fffffffffff) + 0x30),
                             (GCstr *)(pTVar1[1].u64 & 0x7fffffffffff));
      return pTVar1;
    }
    lj_err_argt(L,2,4);
  }
  lj_err_argt(L,1,7);
}

Assistant:

static TValue *ffi_clib_index(lua_State *L)
{
  TValue *o = L->base;
  CLibrary *cl;
  if (!(o < L->top && tvisudata(o) && udataV(o)->udtype == UDTYPE_FFI_CLIB))
    lj_err_argt(L, 1, LUA_TUSERDATA);
  cl = (CLibrary *)uddata(udataV(o));
  if (!(o+1 < L->top && tvisstr(o+1)))
    lj_err_argt(L, 2, LUA_TSTRING);
  return lj_clib_index(L, cl, strV(o+1));
}